

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseOperatorName(State *state)

{
  char cVar1;
  byte bVar2;
  undefined1 uVar3;
  short sVar4;
  undefined1 uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  undefined8 *puVar16;
  undefined4 local_2c;
  undefined4 uStack_28;
  
  pcVar15 = state->mangled_cur;
  if (*pcVar15 != '\0') {
    lVar13 = -1;
    do {
      if (lVar13 == 0) {
        lVar14 = 1;
        break;
      }
      lVar14 = lVar13 + 1;
      lVar11 = lVar13 + 2;
      lVar13 = lVar14;
    } while (pcVar15[lVar11] != '\0');
    if (lVar14 == 0) {
      return false;
    }
    pcVar6 = state->mangled_cur;
    pcVar7 = state->out_cur;
    pcVar8 = state->out_begin;
    pcVar9 = state->out_end;
    uVar10 = *(undefined8 *)((long)&state->prev_name + 4);
    uStack_28 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
    local_2c = (undefined4)((ulong)pcVar9 >> 0x20);
    sVar4 = state->nest_level;
    uVar3 = state->append;
    uVar5 = state->overflowed;
    if ((*pcVar15 == 'c') && (pcVar15[1] == 'v')) {
      state->mangled_cur = pcVar15 + 2;
      MaybeAppend(state,"operator ");
      state->nest_level = 0;
      bVar12 = ParseType(state);
      if (bVar12) {
        state->nest_level = sVar4;
        return true;
      }
    }
    state->mangled_cur = pcVar6;
    state->out_cur = pcVar7;
    *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_28,local_2c);
    *(undefined8 *)((long)&state->prev_name + 4) = uVar10;
    state->out_begin = pcVar8;
    state->out_end = pcVar9;
    state->nest_level = sVar4;
    state->append = (bool)uVar3;
    state->overflowed = (bool)uVar5;
    pcVar15 = state->mangled_cur;
    if (*pcVar15 == 'v') {
      state->mangled_cur = pcVar15 + 1;
      bVar12 = true;
      if (pcVar15[1] != '0') {
        lVar13 = 1;
        do {
          cVar1 = "0123456789"[lVar13];
          if (lVar13 == 10) {
            bVar12 = cVar1 != '\0';
            goto LAB_00119e27;
          }
          lVar13 = lVar13 + 1;
        } while (pcVar15[1] != cVar1);
        bVar12 = cVar1 != '\0';
      }
      state->mangled_cur = pcVar15 + 2;
LAB_00119e27:
      if ((bVar12) && (bVar12 = ParseSourceName(state), bVar12)) {
        return true;
      }
    }
    state->mangled_cur = pcVar6;
    state->out_cur = pcVar7;
    *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_28,local_2c);
    *(undefined8 *)((long)&state->prev_name + 4) = uVar10;
    state->out_begin = pcVar8;
    state->out_end = pcVar9;
    state->nest_level = sVar4;
    state->append = (bool)uVar3;
    state->overflowed = (bool)uVar5;
    cVar1 = *state->mangled_cur;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) &&
       (bVar2 = state->mangled_cur[1], (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
      pcVar15 = "nw";
      puVar16 = (undefined8 *)(kOperatorList + 0x10);
      while ((cVar1 != *pcVar15 || (bVar2 != pcVar15[1]))) {
        pcVar15 = (char *)*puVar16;
        puVar16 = puVar16 + 2;
        if (pcVar15 == (char *)0x0) {
          return pcVar15 != (char *)0x0;
        }
      }
      MaybeAppend(state,"operator");
      pcVar15 = (char *)puVar16[-1];
      if ((byte)(*pcVar15 + 0x9fU) < 0x1a) {
        MaybeAppend(state," ");
      }
      MaybeAppend(state,pcVar15);
      state->mangled_cur = state->mangled_cur + 2;
      return true;
    }
  }
  return false;
}

Assistant:

static bool ParseOperatorName(State *state) {
  if (!AtLeastNumCharsRemaining(state->mangled_cur, 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  State copy = *state;
  if (ParseTwoCharToken(state, "cv") &&
      MaybeAppend(state, "operator ") &&
      EnterNestedName(state) &&
      ParseType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    return true;
  }
  *state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseCharClass(state, "0123456789") &&
      ParseSourceName(state)) {
    return true;
  }
  *state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(state->mangled_cur[0]) &&
        IsAlpha(state->mangled_cur[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != NULL; ++p) {
    if (state->mangled_cur[0] == p->abbrev[0] &&
        state->mangled_cur[1] == p->abbrev[1]) {
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->mangled_cur += 2;
      return true;
    }
  }
  return false;
}